

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_object_data_finalizer(JSRuntime *rt,JSValue val)

{
  int iVar1;
  int64_t iVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  JSValue v;
  
  JVar4 = val.u;
  iVar2 = *(int64_t *)((long)JVar4.ptr + 0x38);
  if (0xfffffff4 < (uint)iVar2) {
    JVar3 = (JSValueUnion)((JSValueUnion *)((long)JVar4.ptr + 0x30))->ptr;
    iVar1 = *JVar3.ptr;
    *(int *)JVar3.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v.tag = iVar2;
      v.u.ptr = JVar3.ptr;
      __JS_FreeValueRT(rt,v);
    }
  }
  *(undefined4 *)((long)JVar4.ptr + 0x30) = 0;
  *(undefined8 *)((long)JVar4.ptr + 0x38) = 3;
  return;
}

Assistant:

static void js_object_data_finalizer(JSRuntime *rt, JSValue val)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    JS_FreeValueRT(rt, p->u.object_data);
    p->u.object_data = JS_UNDEFINED;
}